

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_filter.cpp
# Opt level: O1

void __thiscall cppcms::copy_filter::copy_filter(copy_filter *this,ostream *output)

{
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *plVar1;
  streambuf *psVar2;
  long *plVar3;
  pointer *__ptr;
  
  (this->d).ptr_ = (data *)0x0;
  booster::streambuf::streambuf(&this->copy_buffer_);
  this->output_ = output;
  psVar2 = (streambuf *)std::ios::rdbuf((streambuf *)(output + *(long *)(*(long *)output + -0x18)));
  std::ostream::ostream(&this->real_output_stream_,psVar2);
  plVar1 = &this->data_;
  (this->data_).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->data_).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->data_).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this->detached_ = false;
  plVar3 = (long *)operator_new(0x18);
  *plVar3 = (long)&PTR_read_0028cf78;
  plVar3[1] = (long)&this->real_output_stream_;
  plVar3[2] = (long)plVar1;
  booster::streambuf::device(&this->copy_buffer_);
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 0x20))();
  }
  return;
}

Assistant:

copy_filter::copy_filter(std::ostream &output) :
		output_(output),
		real_output_stream_(output.rdbuf(&copy_buffer_)),
		detached_(false)
	{
		std::unique_ptr<booster::io_device> device(new tee_device(real_output_stream_,data_));
		copy_buffer_.device(std::move(device));
	}